

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O3

Status __thiscall leveldb::TableBuilder::Finish(TableBuilder *this)

{
  Comparator *pCVar1;
  Options *pOVar2;
  char *state;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Options *pOVar5;
  Rep *pRVar6;
  TableBuilder *in_RSI;
  long in_FS_OFFSET;
  BlockHandle index_block_handle;
  BlockHandle metaindex_block_handle;
  BlockHandle filter_block_handle;
  string handle_encoding;
  string key;
  BlockBuilder meta_index_block;
  Slice local_128;
  Slice local_118;
  BlockHandle local_108;
  BlockHandle local_f8;
  BlockHandle local_e8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  Logger *local_70;
  pointer local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  FilterPolicy *local_30;
  
  local_30 = *(FilterPolicy **)(in_FS_OFFSET + 0x28);
  pRVar6 = in_RSI->rep_;
  Flush(in_RSI);
  if (pRVar6->closed == true) {
    __assert_fail("!r->closed",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,0xc9,"Status leveldb::TableBuilder::Finish()");
  }
  pRVar6->closed = true;
  local_e8.offset_._0_4_ = 0xffffffff;
  local_e8.offset_._4_4_ = 0xffffffff;
  local_e8.size_._0_4_ = 0xffffffff;
  local_e8.size_._4_4_ = 0xffffffff;
  local_f8.offset_._0_4_ = 0xffffffff;
  local_f8.offset_._4_4_ = 0xffffffff;
  local_f8.size_._0_4_ = 0xffffffff;
  local_f8.size_._4_4_ = 0xffffffff;
  local_108.offset_._0_4_ = 0xffffffff;
  local_108.offset_._4_4_ = 0xffffffff;
  local_108.size_._0_4_ = 0xffffffff;
  local_108.size_._4_4_ = 0xffffffff;
  bVar3 = ok(in_RSI);
  if ((bVar3) && (pRVar6->filter_block != (FilterBlockBuilder *)0x0)) {
    local_98 = (undefined1  [16])FilterBlockBuilder::Finish(pRVar6->filter_block);
    WriteRawBlock(in_RSI,(Slice *)local_98,kNoCompression,&local_e8);
  }
  bVar3 = ok(in_RSI);
  if (bVar3) {
    BlockBuilder::BlockBuilder((BlockBuilder *)local_98,&pRVar6->options);
    if (pRVar6->filter_block != (FilterBlockBuilder *)0x0) {
      local_b8._0_8_ = (Options *)(local_b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"filter.","");
      iVar4 = (*((pRVar6->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (char *)CONCAT44(extraout_var,iVar4));
      local_d8._8_8_ = (pointer)0x0;
      local_d8[0x10] = '\0';
      local_d8._0_8_ = (Options *)(local_d8 + 0x10);
      BlockHandle::EncodeTo(&local_e8,(string *)local_d8);
      local_118.data_ = (char *)local_b8._0_8_;
      local_118.size_ = local_b8._8_8_;
      local_128.data_ = (char *)local_d8._0_8_;
      local_128.size_ = local_d8._8_8_;
      BlockBuilder::Add((BlockBuilder *)local_98,&local_118,&local_128);
      if ((Options *)local_d8._0_8_ != (Options *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
      }
      if ((Options *)local_b8._0_8_ != (Options *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
      }
    }
    WriteBlock(in_RSI,(BlockBuilder *)local_98,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if (local_70 != (Logger *)0x0) {
      operator_delete(local_70,(long)local_60 - (long)local_70);
    }
    if ((undefined1 *)local_98._8_8_ != local_88 + 8) {
      operator_delete((void *)local_98._8_8_,local_88._8_8_ + 1);
    }
  }
  bVar3 = ok(in_RSI);
  if (bVar3) {
    if (pRVar6->pending_index_entry == true) {
      pCVar1 = (pRVar6->options).comparator;
      (*pCVar1->_vptr_Comparator[5])(pCVar1,&pRVar6->last_key);
      local_98._8_8_ = 0;
      local_98._0_8_ = (Options *)local_88;
      local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
      BlockHandle::EncodeTo(&pRVar6->pending_handle,(string *)local_98);
      local_b8._0_8_ = (pRVar6->last_key)._M_dataplus._M_p;
      local_b8._8_8_ = (pRVar6->last_key)._M_string_length;
      local_d8._0_8_ = local_98._0_8_;
      local_d8._8_8_ = local_98._8_8_;
      BlockBuilder::Add(&pRVar6->index_block,(Slice *)local_b8,(Slice *)local_d8);
      pRVar6->pending_index_entry = false;
      if ((Options *)local_98._0_8_ != (Options *)local_88) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
    }
    WriteBlock(in_RSI,&pRVar6->index_block,&local_108);
  }
  bVar3 = ok(in_RSI);
  if (bVar3) {
    local_98._4_4_ = local_f8.offset_._4_4_;
    local_98._0_4_ = (undefined4)local_f8.offset_;
    local_98._12_4_ = local_f8.size_._4_4_;
    local_98._8_4_ = (undefined4)local_f8.size_;
    local_88._0_8_ = CONCAT44(local_108.offset_._4_4_,(undefined4)local_108.offset_);
    local_88._8_8_ = CONCAT44(local_108.size_._4_4_,(undefined4)local_108.size_);
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = '\0';
    local_b8._0_8_ = (Options *)(local_b8 + 0x10);
    Footer::EncodeTo((Footer *)local_98,(string *)local_b8);
    local_d8._0_8_ = local_b8._0_8_;
    local_d8._8_8_ = local_b8._8_8_;
    (*pRVar6->file->_vptr_WritableFile[2])(&local_118);
    pOVar2 = (Options *)(pRVar6->status).state_;
    (pRVar6->status).state_ = local_118.data_;
    pOVar5 = (Options *)local_118.data_;
    local_118.data_ = (char *)pOVar2;
    if (pOVar2 != (Options *)0x0) {
      operator_delete__(pOVar2);
      pOVar5 = (Options *)(pRVar6->status).state_;
    }
    if (pOVar5 == (Options *)0x0) {
      pRVar6->offset = (uint64_t)(local_b8._8_8_ + pRVar6->offset);
    }
    if ((Options *)local_b8._0_8_ != (Options *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
  }
  state = (pRVar6->status).state_;
  if (state == (char *)0x0) {
    pRVar6 = (Rep *)0x0;
  }
  else {
    pRVar6 = (Rep *)Status::CopyState(state);
  }
  this->rep_ = pRVar6;
  if (*(FilterPolicy **)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status TableBuilder::Finish() {
  Rep* r = rep_;
  Flush();
  assert(!r->closed);
  r->closed = true;

  BlockHandle filter_block_handle, metaindex_block_handle, index_block_handle;

  // Write filter block
  if (ok() && r->filter_block != nullptr) {
    WriteRawBlock(r->filter_block->Finish(), kNoCompression,
                  &filter_block_handle);
  }

  // Write metaindex block
  if (ok()) {
    BlockBuilder meta_index_block(&r->options);
    if (r->filter_block != nullptr) {
      // Add mapping from "filter.Name" to location of filter data
      std::string key = "filter.";
      key.append(r->options.filter_policy->Name());
      std::string handle_encoding;
      filter_block_handle.EncodeTo(&handle_encoding);
      meta_index_block.Add(key, handle_encoding);
    }

    // TODO(postrelease): Add stats and other meta blocks
    WriteBlock(&meta_index_block, &metaindex_block_handle);
  }

  // Write index block
  if (ok()) {
    if (r->pending_index_entry) {
      r->options.comparator->FindShortSuccessor(&r->last_key);
      std::string handle_encoding;
      r->pending_handle.EncodeTo(&handle_encoding);
      r->index_block.Add(r->last_key, Slice(handle_encoding));
      r->pending_index_entry = false;
    }
    WriteBlock(&r->index_block, &index_block_handle);
  }

  // Write footer
  if (ok()) {
    Footer footer;
    footer.set_metaindex_handle(metaindex_block_handle);
    footer.set_index_handle(index_block_handle);
    std::string footer_encoding;
    footer.EncodeTo(&footer_encoding);
    r->status = r->file->Append(footer_encoding);
    if (r->status.ok()) {
      r->offset += footer_encoding.size();
    }
  }
  return r->status;
}